

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

CConvertVisitor * __thiscall CConvertVisitor::GetResult_abi_cxx11_(CConvertVisitor *this)

{
  long in_RSI;
  CConvertVisitor *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

std::string CConvertVisitor::GetResult() {
	return code;
}